

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVarious.hpp
# Opt level: O0

void __thiscall Omega_take_drop_Test::TestBody(Omega_take_drop_Test *this)

{
  bool bVar1;
  char *pcVar2;
  tuple<int,_int,_int,_const_char_*,_int,_int,_double> *in_RDX;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_c0;
  int local_bc;
  tuple<int,_int> local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  __type t2;
  Message local_90 [3];
  double local_78;
  int local_6c [3];
  tuple<int,_const_char_*,_int,_int,_double> local_60;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  __type t1;
  Omega_take_drop_Test *this_local;
  
  omega::drop<2,std::tuple<int,int,int,char_const*,int,int,double>const&>
            ((__type *)&gtest_ar.message_,(omega *)&::t,in_RDX);
  local_6c[2] = 7;
  local_6c[1] = 8;
  local_6c[0] = 9;
  local_78 = 10.5;
  std::make_tuple<int,char_const(&)[7],int,int,double>
            (&local_60,local_6c + 2,(char (*) [7])0x1a00a3,local_6c + 1,local_6c,&local_78);
  testing::internal::EqHelper<false>::
  Compare<std::tuple<int,char_const*,int,int,double>,std::tuple<int,char_const*,int,int,double>>
            ((EqHelper<false> *)local_40,"t1","std::make_tuple(7, \"yuppi!\", 8, 9, 10.5)",
             (tuple<int,_const_char_*,_int,_int,_double> *)&gtest_ar.message_,&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&t2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/meox[P]omega/Test/TestVarious.hpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&t2,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&t2);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  omega::take<2,std::tuple<int,int,int,char_const*,int,int,double>const&>
            ((omega *)&gtest_ar_1.message_,&::t);
  local_bc = 5;
  local_c0 = 6;
  std::make_tuple<int,int>((int *)&local_b8,&local_bc);
  testing::internal::EqHelper<false>::Compare<std::tuple<int,int>,std::tuple<int,int>>
            ((EqHelper<false> *)local_b0,"t2","std::make_tuple(5, 6)",
             (tuple<int,_int> *)&gtest_ar_1.message_,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/meox[P]omega/Test/TestVarious.hpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  return;
}

Assistant:

TEST(Omega, take_drop)
{
    const auto t1 = omega::drop<2>(t);
    EXPECT_EQ (t1, std::make_tuple(7, "yuppi!", 8, 9, 10.5));

    const auto t2 = omega::take<2>(t);
    EXPECT_EQ (t2, std::make_tuple(5, 6));
}